

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRSInterface.cpp
# Opt level: O3

int connectrazorahrsinterface(RS232PORT *pRazorAHRSInterfacePseudoRS232Port)

{
  int iVar1;
  
  iVar1 = OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port,szRazorAHRSInterfacePath);
  if (iVar1 != 0) {
    puts("Unable to connect to a RazorAHRSInterface.");
    return 1;
  }
  if (3 < pRazorAHRSInterfacePseudoRS232Port->DevType - 1U) {
    if ((pRazorAHRSInterfacePseudoRS232Port->DevType != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          (pRazorAHRSInterfacePseudoRS232Port->hDev,RazorAHRSInterfaceBaudRate,'\0',
                           0,'\b','\0',RazorAHRSInterfaceTimeout), iVar1 != 0)) {
      puts("Unable to connect to a RazorAHRSInterface.");
      CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
      return 1;
    }
    tcflush(*(int *)&pRazorAHRSInterfacePseudoRS232Port->hDev,2);
  }
  puts("RazorAHRSInterface connected.");
  return 0;
}

Assistant:

int connectrazorahrsinterface(RS232PORT* pRazorAHRSInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port, szRazorAHRSInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pRazorAHRSInterfacePseudoRS232Port, RazorAHRSInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)RazorAHRSInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("RazorAHRSInterface connected.\n");

	return EXIT_SUCCESS;
}